

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbmradix.c
# Opt level: O2

void rsorta(string *a,int n,int b)

{
  string *ppuVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  int b_00;
  string puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  uint uVar9;
  string puVar10;
  int iVar11;
  long lVar12;
  string *a_00;
  long lVar13;
  string *ppuVar14;
  uint uVar15;
  undefined1 (*pauVar16) [16];
  uint uVar17;
  int *piVar18;
  int *piVar19;
  undefined1 (*pauVar20) [16];
  int *piVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  long local_4858;
  mbmstack_t stmp;
  string *pile [256];
  mbmstack_t stack [1024];
  
  stack[0].sa = a;
  stack[0].sn = n;
  stack[0].si = b;
  lVar12 = 0x10;
  do {
    while( true ) {
      while( true ) {
        if (lVar12 < 1) {
          return;
        }
        local_4858 = lVar12 + -0x10;
        a_00 = *(string **)((long)pile + lVar12 + 0x7f0);
        iVar8 = *(int *)((long)pile + lVar12 + 0x7f8);
        lVar13 = (long)iVar8;
        b_00 = *(int *)((long)pile + lVar12 + 0x7fc);
        if (9 < lVar13) break;
        for (lVar23 = 1; lVar12 = local_4858, lVar22 = lVar23, lVar23 < lVar13; lVar23 = lVar23 + 1)
        {
          while ((0 < lVar22 &&
                 (iVar8 = scmp(a_00[lVar22 + -1] + b_00,a_00[lVar22] + b_00), 0 < iVar8))) {
            auVar2 = *(undefined1 (*) [16])(a_00 + lVar22 + -1);
            auVar24._0_8_ = auVar2._8_8_;
            auVar24._8_4_ = auVar2._0_4_;
            auVar24._12_4_ = auVar2._4_4_;
            *(undefined1 (*) [16])(a_00 + lVar22 + -1) = auVar24;
            lVar22 = lVar22 + -1;
          }
        }
      }
      ppuVar1 = a_00 + lVar13;
      uVar9 = rsorta::nc;
      uVar15 = rsorta::cmin;
      if (rsorta::nc == 0) break;
LAB_001d3719:
      pauVar20 = (undefined1 (*) [16])((long)pile + lVar12 + 0x7f0);
      ppuVar14 = a_00 + rsorta::count[0];
      pile[0] = ppuVar14;
      piVar18 = rsorta::count + uVar15;
      iVar8 = 2;
      lVar13 = 0;
      pauVar16 = pauVar20;
      while (0 < (int)uVar9) {
        lVar23 = (long)piVar18 * 0x40000000 + -0x2fa09900000000;
        piVar21 = piVar18 + -0x2fa099;
        do {
          piVar19 = piVar18;
          lVar23 = lVar23 + 0x100000000;
          iVar11 = *piVar19;
          piVar18 = piVar19 + 1;
          piVar21 = piVar21 + 1;
        } while (iVar11 == 0);
        if (1 < iVar11) {
          if (iVar8 < iVar11) {
            iVar8 = iVar11;
            pauVar16 = (undefined1 (*) [16])((long)&stack[0].sa + local_4858);
          }
          *(string **)((long)&stack[0].sa + local_4858) = ppuVar14;
          *(int *)((long)&stack[0].sn + local_4858) = iVar11;
          *(int *)((long)&stack[0].si + local_4858) = b_00 + 1;
          local_4858 = local_4858 + 0x10;
          iVar11 = *piVar19;
        }
        ppuVar14 = ppuVar14 + iVar11;
        lVar13 = (long)piVar21 >> 2;
        pile[lVar23 >> 0x20] = ppuVar14;
        uVar9 = uVar9 - 1;
        rsorta::nc = uVar9;
      }
      uVar5 = *(undefined8 *)*pauVar20;
      uVar6 = *(undefined8 *)((long)pile + lVar12 + 0x7f8);
      uVar7 = *(undefined8 *)(*pauVar16 + 8);
      *(undefined8 *)*pauVar20 = *(undefined8 *)*pauVar16;
      *(undefined8 *)((long)pile + lVar12 + 0x7f8) = uVar7;
      auVar2._8_8_ = uVar6;
      auVar2._0_8_ = uVar5;
      *pauVar16 = auVar2;
      iVar8 = rsorta::count[(int)lVar13];
      rsorta::count[(int)lVar13] = 0;
      for (; lVar12 = local_4858, a_00 < ppuVar1 + -(long)iVar8; a_00 = a_00 + iVar11) {
        puVar10 = *a_00;
        while( true ) {
          bVar3 = puVar10[b_00];
          ppuVar14 = pile[bVar3] + -1;
          pile[bVar3] = ppuVar14;
          if (ppuVar14 <= a_00) break;
          puVar4 = *ppuVar14;
          *ppuVar14 = puVar10;
          puVar10 = puVar4;
        }
        *a_00 = puVar10;
        iVar11 = rsorta::count[bVar3];
        rsorta::count[bVar3] = 0;
      }
    }
    rsorta::cmin = 0xff;
    uVar15 = 0xff;
    uVar9 = 0;
    ppuVar14 = a_00;
    while (ppuVar14 < ppuVar1) {
      puVar10 = *ppuVar14;
      ppuVar14 = ppuVar14 + 1;
      bVar3 = puVar10[b_00];
      iVar11 = rsorta::count[bVar3];
      rsorta::count[bVar3] = iVar11 + 1;
      if (iVar11 == 0 && bVar3 != 0) {
        uVar17 = (uint)bVar3;
        if (uVar17 < uVar15) {
          uVar15 = uVar17;
          rsorta::cmin = uVar17;
        }
        uVar9 = uVar9 + 1;
        rsorta::nc = uVar9;
      }
    }
    if ((long)((ulong)uVar9 * 0x10 + local_4858) < 0x4001) goto LAB_001d3719;
    rsorta(a_00,iVar8,b_00);
    lVar12 = local_4858;
  } while( true );
}

Assistant:

static void rsorta(string *a, int n, int b)
{
#define push(a, n, i)   sp->sa = a, sp->sn = n, (sp++)->si = i
#define pop(a, n, i)    a = (--sp)->sa, n = sp->sn, i = sp->si
#define stackempty()    (sp <= stack)
#define swap(p, q, r)   r = p, p = q, q = r
        mbmstack_t      stack[SIZE], *sp = stack, stmp, *oldsp, *bigsp;
        string          *pile[256], *ak, *an, r, t;
        static int      count[256], cmin, nc;
        int             *cp, c, cmax;

        push(a, n, b);

        while(!stackempty()) {
                pop(a, n, b);
                if(n < THRESHOLD) {
                        simplesort(a, n, b);
                        continue;
                }
                an = a + n;
                if(nc == 0) {                       /* untallied? */
                        cmin = 255;                 /* tally */
                        for(ak = a; ak < an; ) {
                                c = (*ak++)[b];
                                if(++count[c] == 1 && c > 0) {
                                        if(c < cmin) cmin = c;
                                        nc++;
                                }
                        }
                        if(sp+nc > stack+SIZE) {     /* stack overflow */
                                  rsorta(a, n, b);
                                  continue;
                        }
                }
                oldsp = bigsp = sp, c = 2;         /* logartihmic stack */
                pile[0] = ak = a+count[cmax=0];    /* find places */
                for(cp = count+cmin; nc > 0; cp++, nc--) {
                         while(*cp == 0) cp++;
                         if (*cp > 1) {
                                  if(*cp > c) c = *cp, bigsp = sp;
                                  push(ak, *cp, b+1);
                         }
                         pile[cmax = cp-count] = ak += *cp;
                }
                swap(*oldsp, *bigsp, stmp);
                an -= count[cmax];                 /* permute home */
                count[cmax] = 0;
                for(ak = a; ak < an; ak += count[c], count[c] = 0) {
                        r = *ak;
                        while(--pile[c = r[b]] > ak)
                                swap(*pile[c], r, t);
                        *ak = r;
                                /* here nc = count[...] = 0 */
                }
        }
}